

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::BufferView::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  long *plVar1;
  undefined8 uVar2;
  deUint64 dVar3;
  Parameters *env_00;
  VkResult result;
  Handle<(vk::HandleType)8> *pHVar4;
  Handle<(vk::HandleType)7> *pHVar5;
  Parameters PVar6;
  Parameters local_30;
  Parameters *local_20;
  Parameters *params_local;
  Environment *env_local;
  Resources *this_local;
  
  local_20 = params;
  params_local = (Parameters *)env;
  env_local = (Environment *)this;
  Dependency<vkt::api::(anonymous_namespace)::Buffer>::Dependency(&this->buffer,env,&params->buffer)
  ;
  env_00 = params_local;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  PVar6 = getDeviceMemoryParameters((Environment *)env_00,(VkBuffer)pHVar4->m_internal);
  local_30.size = PVar6.size;
  local_30.memoryTypeIndex = PVar6.memoryTypeIndex;
  Dependency<vkt::api::(anonymous_namespace)::DeviceMemory>::Dependency
            (&this->memory,(Environment *)env_00,&local_30);
  plVar1 = *(long **)&(params_local->buffer).usage;
  uVar2 = *(undefined8 *)&params_local->format;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar3 = pHVar4->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  result = (**(code **)(*plVar1 + 0x60))(plVar1,uVar2,dVar3,pHVar5->m_internal,0);
  ::vk::checkResult(result,"env.vkd.bindBufferMemory(env.device, *buffer.object, *memory.object, 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x2c7);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: buffer(env, params.buffer)
			, memory(env, getDeviceMemoryParameters(env, *buffer.object))
		{
			VK_CHECK(env.vkd.bindBufferMemory(env.device, *buffer.object, *memory.object, 0));
		}